

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void * mz_zip_reader_extract_to_heap
                 (mz_zip_archive *pZip,mz_uint file_index,size_t *pSize,mz_uint flags)

{
  mz_bool mVar1;
  uint in_ECX;
  undefined8 *in_RDX;
  long in_RDI;
  void *pBuf;
  mz_uint64 alloc_size;
  mz_zip_archive_file_stat file_stat;
  void *in_stack_00002b38;
  mz_uint in_stack_00002b44;
  size_t in_stack_00002b48;
  void *in_stack_00002b50;
  mz_uint in_stack_00002b5c;
  mz_zip_archive *in_stack_00002b60;
  size_t in_stack_00002c40;
  mz_zip_archive_file_stat *in_stack_00002c48;
  mz_zip_archive_file_stat *in_stack_fffffffffffffb58;
  undefined8 in_stack_fffffffffffffb60;
  mz_zip_archive *in_stack_fffffffffffffb68;
  undefined8 local_468;
  undefined8 local_460;
  void *local_18;
  
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = 0;
  }
  mVar1 = mz_zip_reader_file_stat
                    (in_stack_fffffffffffffb68,(mz_uint)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                     in_stack_fffffffffffffb58);
  if (mVar1 == 0) {
    local_18 = (void *)0x0;
  }
  else {
    if ((in_ECX & 0x400) != 0) {
      local_460 = local_468;
    }
    local_18 = (void *)(**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x40),1,local_460);
    if (local_18 == (void *)0x0) {
      if (in_RDI != 0) {
        *(undefined4 *)(in_RDI + 0x1c) = 0x10;
      }
      local_18 = (void *)0x0;
    }
    else {
      mVar1 = mz_zip_reader_extract_to_mem_no_alloc1
                        (in_stack_00002b60,in_stack_00002b5c,in_stack_00002b50,in_stack_00002b48,
                         in_stack_00002b44,in_stack_00002b38,in_stack_00002c40,in_stack_00002c48);
      if (mVar1 == 0) {
        (**(code **)(in_RDI + 0x30))(*(undefined8 *)(in_RDI + 0x40),local_18);
        local_18 = (void *)0x0;
      }
      else if (in_RDX != (undefined8 *)0x0) {
        *in_RDX = local_460;
      }
    }
  }
  return local_18;
}

Assistant:

void *mz_zip_reader_extract_to_heap(mz_zip_archive *pZip, mz_uint file_index,
                                    size_t *pSize, mz_uint flags) {
  mz_zip_archive_file_stat file_stat;
  mz_uint64 alloc_size;
  void *pBuf;

  if (pSize)
    *pSize = 0;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return NULL;

  alloc_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? file_stat.m_comp_size
                                                     : file_stat.m_uncomp_size;
  if (((sizeof(size_t) == sizeof(mz_uint32))) && (alloc_size > 0x7FFFFFFF)) {
    mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
    return NULL;
  }

  if (NULL ==
      (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)alloc_size))) {
    mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    return NULL;
  }

  if (!mz_zip_reader_extract_to_mem_no_alloc1(pZip, file_index, pBuf,
                                              (size_t)alloc_size, flags, NULL,
                                              0, &file_stat)) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
    return NULL;
  }

  if (pSize)
    *pSize = (size_t)alloc_size;
  return pBuf;
}